

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O3

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,CbQueue *cq)

{
  int iVar1;
  Buffer *__ptr;
  Buffer *pBVar2;
  ulong uVar3;
  
  uVar3 = (ulong)cq->off;
  if (uVar3 != 0) {
    write_some(this,cq->beg->data + uVar3,cq->beg->used - uVar3);
    __ptr = cq->beg;
    pBVar2 = __ptr->next;
    iVar1 = __ptr->cpt_use;
    __ptr->cpt_use = iVar1 + -1;
    if (iVar1 < 1) {
      ::free(__ptr);
    }
    cq->beg = pBVar2;
  }
  if (this->beg == (Buffer *)0x0) {
    this->beg = cq->beg;
    this->off = 0;
  }
  else {
    this->end->next = cq->beg;
  }
  this->end = cq->end;
  cq->beg = (Buffer *)0x0;
  cq->end = (Buffer *)0x8;
  cq->off = 0;
  return;
}

Assistant:

void CbQueue::write_some( CbQueue &&cq ) {
    if ( cq.off ) {
        write_some( cq.beg->data + cq.off, cq.beg->used - cq.off );
        Buffer *n = cq.beg->next;
        Buffer::dec_ref( cq.beg );
        cq.beg = n;
    }

    if ( not beg ) {
        beg = cq.beg;
        off = 0;
    } else {
        end->next = cq.beg;
    }
    end = cq.end;

    // we don't want to dec_ref the buffers of cq (which are now used in this)
    new ( &cq ) CbQueue;
}